

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> *
HdlcSimulationDataGenerator::CrcDivision
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *stream,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *genPoly,U32 crcNumber)

{
  pointer *ppuVar1;
  iterator __position;
  undefined8 uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  uint uVar11;
  U64 byteValue;
  vector<BitState,_std::allocator<BitState>_> dataBits;
  DataBuilder dbyte;
  vector<BitState,_std::allocator<BitState>_> polyBits;
  uchar local_75;
  uint local_74;
  undefined8 local_70;
  vector<BitState,_std::allocator<BitState>_> local_68;
  DataBuilder local_50 [8];
  vector<BitState,_std::allocator<BitState>_> local_48;
  
  BytesVectorToBitsVector
            (&local_68,stream,
             (*(int *)&(stream->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
             *(int *)&(stream->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start) * 8);
  BytesVectorToBitsVector(&local_48,genPoly,crcNumber + 1);
  uVar3 = (long)local_68.super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_68.super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
  uVar5 = (long)local_48.super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_48.super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
  iVar6 = (int)uVar3 - (int)uVar5;
  uVar7 = iVar6 + 1;
  if (iVar6 != -1) {
    uVar9 = 0;
    do {
      do {
        if (uVar3 <= uVar9) goto LAB_0010e5d5;
        bVar10 = (uint)uVar9 < uVar7 &&
                 local_68.super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar9] == BIT_LOW;
        uVar8 = (uint)uVar9 + (uint)bVar10;
        uVar9 = (ulong)uVar8;
      } while (bVar10);
      if (uVar8 < uVar7 &&
          local_48.super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_48.super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar11 = 1;
        uVar9 = 0;
        uVar4 = uVar8;
        do {
          if (uVar3 <= uVar4) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
            goto LAB_0010e5c7;
          }
          local_68.super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
          super__Vector_impl_data._M_start[uVar4] =
               local_68.super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
               super__Vector_impl_data._M_start[uVar4] ^
               local_48.super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
               super__Vector_impl_data._M_start[uVar9];
          uVar9 = (ulong)uVar11;
          uVar4 = uVar4 + 1;
          uVar11 = uVar11 + 1;
        } while (uVar9 < uVar5);
      }
      uVar9 = (ulong)(uVar8 + 1);
    } while (uVar8 + 1 < uVar7);
  }
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (7 < crcNumber) {
    local_74 = crcNumber >> 3;
    uVar7 = 0;
    do {
      local_70 = 0;
      DataBuilder::DataBuilder(local_50);
      DataBuilder::Reset((ulonglong *)local_50,(ShiftOrder)&local_70,0);
      uVar4 = crcNumber & 0xff;
      uVar8 = (int)((ulong)((long)local_68.super__Vector_base<BitState,_std::allocator<BitState>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_68.super__Vector_base<BitState,_std::allocator<BitState>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2) - uVar4;
      uVar5 = (ulong)uVar8;
      uVar3 = (long)local_68.super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_68.super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2;
      if (uVar5 < (8 - (ulong)uVar4) + uVar3) {
        do {
          uVar8 = uVar8 + 1;
          if (uVar3 <= uVar5) goto LAB_0010e5c7;
          DataBuilder::AddBit((BitState)local_50);
          uVar5 = (ulong)uVar8;
          uVar3 = (long)local_68.super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_68.super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2;
        } while (uVar5 < (8 - (ulong)uVar4) + uVar3);
      }
      local_75 = (uchar)local_70;
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                  (__return_storage_ptr__,__position,&local_75);
      }
      else {
        *__position._M_current = (uchar)local_70;
        ppuVar1 = &(__return_storage_ptr__->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      crcNumber = uVar4 - 8;
      DataBuilder::~DataBuilder(local_50);
      uVar7 = uVar7 + 1;
    } while (uVar7 != local_74);
  }
  if (local_48.super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
LAB_0010e5c7:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0010e5d5:
  uVar2 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  if (local_68.super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  _Unwind_Resume(uVar2);
}

Assistant:

vector<U8> HdlcSimulationDataGenerator::CrcDivision( const vector<U8>& stream, const vector<U8>& genPoly, U32 crcNumber )
{
    vector<BitState> dataBits = BytesVectorToBitsVector( stream, stream.size() * 8 );
    vector<BitState> polyBits = BytesVectorToBitsVector( genPoly, crcNumber + 1 );

    U32 dataIndex = 0;
    U32 dataLimit = dataBits.size() - ( polyBits.size() - 1 );
    while( dataIndex < dataLimit )
    {
        // Advance one-position or 0-bits
        bool zeroBits = true;
        while( zeroBits )
        {
            zeroBits = ( ( dataBits.at( dataIndex ) == BIT_LOW ) && ( dataIndex < dataLimit ) );
            if( zeroBits )
            {
                dataIndex++;
            }
        }

        if( dataIndex < dataLimit )
        {
            for( U32 bitIndex = 0; bitIndex < polyBits.size(); ++bitIndex )
            {
                BitState bit = dataBits.at( dataIndex + bitIndex );
                BitState polyBit = polyBits.at( bitIndex );

                dataBits[ dataIndex + bitIndex ] = BitState( bit ^ polyBit );
            }
        }

        dataIndex++;
    }

    // put the crc result in the vector of bytes
    vector<U8> crcRet;
    U8 offset = crcNumber;
    for( U32 s = 0; s < crcNumber / 8; ++s )
    {
        U64 byteValue = 0;
        DataBuilder dbyte;
        dbyte.Reset( &byteValue, AnalyzerEnums::MsbFirst, 8 );
        for( U32 i = dataBits.size() - offset; i < dataBits.size() - offset + 8; ++i )
        {
            dbyte.AddBit( dataBits.at( i ) );
        }
        offset -= 8;
        crcRet.push_back( byteValue );
    }

    return crcRet;
}